

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O0

_Bool arm_cpu_tlb_fill_aarch64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  MMUAccessType access_type_00;
  target_ulong address_00;
  _Bool _Var1;
  ARMMMUIdx mmu_idx_00;
  CPUARMState_conflict *env;
  undefined1 local_88 [8];
  ARMMMUFaultInfo_conflict1 fi;
  MemTxAttrs attrs;
  int ret;
  int prot;
  target_ulong page_size;
  hwaddr phys_addr;
  ARMCPU_conflict1 *cpu;
  uc_struct_conflict2 *uc;
  MMUAccessType MStack_30;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  cpu = (ARMCPU_conflict1 *)cs->uc;
  fi._28_4_ = 0;
  phys_addr = (hwaddr)cs;
  uc._3_1_ = probe;
  uc._4_4_ = mmu_idx;
  MStack_30 = access_type;
  mmu_idx_local = size;
  _access_type_local = address;
  address_local = (vaddr)cs;
  memset(local_88,0,0x20);
  address_00 = _access_type_local;
  access_type_00 = MStack_30;
  env = (CPUARMState_conflict *)(phys_addr + 0xa350);
  mmu_idx_00 = core_to_arm_mmu_idx((CPUARMState_conflict *)(phys_addr + 0xa350),uc._4_4_);
  _Var1 = get_phys_addr_aarch64
                    (env,address_00,access_type_00,mmu_idx_00,&page_size,
                     (MemTxAttrs *)&fi.field_0x1c,(int *)&attrs,(target_ulong *)&ret,
                     (ARMMMUFaultInfo_conflict1 *)local_88,(ARMCacheAttrs *)0x0);
  if (_Var1) {
    if ((uc._3_1_ & 1) == 0) {
      cpu_restore_state_aarch64((CPUState *)address_local,retaddr,true);
      arm_deliver_fault((ARMCPU_conflict1 *)phys_addr,_access_type_local,MStack_30,uc._4_4_,
                        (ARMMMUFaultInfo_conflict1 *)local_88);
    }
    cs_local._7_1_ = false;
  }
  else {
    if ((ulong)(long)-(int)(cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base <= _ret) {
      page_size = (cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base & page_size;
      _access_type_local = (cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base & _access_type_local;
    }
    tlb_set_page_with_attrs_aarch64
              ((CPUState *)address_local,_access_type_local,page_size,(MemTxAttrs)fi._28_4_,
               (int)attrs,uc._4_4_,_ret);
    cs_local._7_1_ = true;
  }
  return cs_local._7_1_;
}

Assistant:

bool arm_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    struct uc_struct *uc = cs->uc;
    ARMCPU *cpu = ARM_CPU(cs);

    hwaddr phys_addr;
    target_ulong page_size;
    int prot, ret;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };

    /*
     * Walk the page table and (if the mapping exists) add the page
     * to the TLB.  On success, return true.  Otherwise, if probing,
     * return false.  Otherwise populate fsr with ARM DFSR/IFSR fault
     * register format, and signal the fault.
     */
    ret = get_phys_addr(&cpu->env, address, access_type,
                        core_to_arm_mmu_idx(&cpu->env, mmu_idx),
                        &phys_addr, &attrs, &prot, &page_size, &fi, NULL);
    if (likely(!ret)) {
        /*
         * Map a single [sub]page. Regions smaller than our declared
         * target page size are handled specially, so for those we
         * pass in the exact addresses.
         */
        if (page_size >= TARGET_PAGE_SIZE) {
            phys_addr &= TARGET_PAGE_MASK;
            address &= TARGET_PAGE_MASK;
        }
        tlb_set_page_with_attrs(cs, address, phys_addr, attrs,
                                prot, mmu_idx, page_size);
        return true;
    } else if (probe) {
        return false;
    } else {
        /* now we have a real cpu fault */
        cpu_restore_state(cs, retaddr, true);
        arm_deliver_fault(cpu, address, access_type, mmu_idx, &fi);
    }
}